

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint32 ma_dr_mp3_bs_get_bits(ma_dr_mp3_bs *bs,int n)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  uVar1 = bs->pos;
  bs->pos = uVar1 + n;
  uVar7 = 0;
  if ((int)(uVar1 + n) <= bs->limit) {
    iVar5 = n + (uVar1 & 7);
    uVar3 = 0xffU >> (sbyte)(uVar1 & 7) & (uint)bs->buf[(int)uVar1 >> 3];
    uVar7 = 0;
    if (8 < iVar5) {
      pbVar4 = bs->buf + ((int)uVar1 >> 3);
      uVar7 = 0;
      iVar6 = iVar5;
      do {
        pbVar4 = pbVar4 + 1;
        iVar5 = iVar6 + -8;
        uVar7 = uVar7 | uVar3 << ((byte)iVar5 & 0x1f);
        uVar3 = (uint)*pbVar4;
        bVar2 = 0x10 < iVar6;
        iVar6 = iVar5;
      } while (bVar2);
    }
    uVar7 = uVar3 >> (8U - (char)iVar5 & 0x1f) | uVar7;
  }
  return uVar7;
}

Assistant:

static ma_uint32 ma_dr_mp3_bs_get_bits(ma_dr_mp3_bs *bs, int n)
{
    ma_uint32 next, cache = 0, s = bs->pos & 7;
    int shl = n + s;
    const ma_uint8 *p = bs->buf + (bs->pos >> 3);
    if ((bs->pos += n) > bs->limit)
        return 0;
    next = *p++ & (255 >> s);
    while ((shl -= 8) > 0)
    {
        cache |= next << shl;
        next = *p++;
    }
    return cache | (next >> -shl);
}